

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall
MakefileGenerator::writeSubTargets
          (MakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  QString *pQVar1;
  QArrayDataPointer<char16_t> *pQVar2;
  short sVar3;
  QMakeProject *pQVar4;
  qsizetype qVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QMakeLocalFileName *pQVar9;
  char16_t *pcVar10;
  Data *pDVar11;
  char cVar12;
  bool bVar13;
  ProStringList *pPVar14;
  QTextStream *pQVar15;
  default_delete<SequentialInstallData> *this_00;
  iterator iVar16;
  iterator iVar17;
  QList<ProString> *pQVar18;
  qsizetype qVar19;
  SubTarget *pSVar20;
  ProStringList *pPVar21;
  ProString *pPVar22;
  uint in_ECX;
  undefined4 in_register_00000014;
  QList<MakefileGenerator::SubTarget_*> *this_01;
  Data *pDVar23;
  int target_2;
  char *ch;
  SubTarget *this_02;
  char *pcVar24;
  MakefileGenerator *pMVar25;
  ProString *pPVar26;
  int target;
  ulong uVar27;
  long in_FS_OFFSET;
  bool bVar28;
  ProString local_2a8;
  undefined1 local_278 [40];
  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]> local_250;
  QArrayDataPointer<char16_t> local_238;
  undefined1 local_218 [24];
  undefined1 local_200 [16];
  QMakeLocalFileName *pQStack_1f0;
  char16_t *local_1e8;
  QArrayDataPointer<char16_t> local_1d8;
  QArrayDataPointer<ProString> local_1b8;
  QArrayDataPointer<char16_t> local_198;
  QArrayDataPointer<ProString> local_178;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  ProKey rtkey;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<QString> local_a8;
  ProKey rkey;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  this_01 = (QList<MakefileGenerator::SubTarget_*> *)CONCAT44(in_register_00000014,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = this->project;
  ProKey::ProKey(&rkey,"QMAKE_EXTRA_INCLUDES");
  pPVar14 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
  pPVar22 = (pPVar14->super_QList<ProString>).d.ptr;
  for (pPVar26 = pPVar22; pPVar26 != pPVar22 + (pPVar14->super_QList<ProString>).d.size;
      pPVar26 = pPVar26 + 1) {
    pQVar15 = (QTextStream *)QTextStream::operator<<(t,"include ");
    pQVar15 = operator<<(pQVar15,pPVar26);
    Qt::endl(pQVar15);
    pPVar22 = (pPVar14->super_QList<ProString>).d.ptr;
  }
  if ((in_ECX & 4) == 0) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[6])(this,t);
    QTextStream::operator<<(t,"SUBTARGETS    = ");
    for (uVar27 = 0; uVar27 < (ulong)(this_01->d).size; uVar27 = uVar27 + 1) {
      pQVar15 = (QTextStream *)QTextStream::operator<<(t," \\\n\t\t");
      QTextStream::operator<<(pQVar15,(QString *)&(this_01->d).ptr[uVar27]->target);
    }
    pQVar15 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar15);
  }
  writeExtraVariables(this,t);
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QString *)0x0;
  local_c8.size = -0x5555555555555556;
  local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar4 = this->project;
  ProKey::ProKey(&rtkey,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first(&rkey.super_ProString,&pQVar4->super_QMakeEvaluator,&rtkey);
  ProString::toQString((QString *)&local_c8,&rkey.super_ProString);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
  if ((in_ECX & 8) == 0) {
    QString::QString((QString *)&rkey,"make_first");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,(QString *)&rkey);
    QString::QString((QString *)&rtkey,"all");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,(QString *)&rtkey);
    QString::QString(&local_2a8.m_string,"clean");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,&local_2a8.m_string);
    QString::QString((QString *)&local_118,"distclean");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,(QString *)&local_118);
    bVar28 = (in_ECX & 1) == 0;
    pcVar24 = "install_subtargets";
    if (bVar28) {
      pcVar24 = "install";
    }
    ch = "uninstall_subtargets";
    if (bVar28) {
      ch = "uninstall";
    }
    QString::QString((QString *)&local_138,pcVar24);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,(QString *)&local_138);
    QString::QString((QString *)&local_158,ch);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_a8,(QString *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
  }
  pQVar4 = this->project;
  QString::QString((QString *)&rkey,"dont_recurse");
  bVar28 = QMakeProject::isActiveConfig(pQVar4,(QString *)&rkey,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
  this_00 = (default_delete<SequentialInstallData> *)0x0;
  for (uVar27 = 0; uVar27 < (ulong)(this_01->d).size; uVar27 = uVar27 + 1) {
    pSVar20 = (this_01->d).ptr[uVar27];
    local_2a8.m_string.d.d = (pSVar20->in_directory).d.d;
    local_2a8.m_string.d.ptr = (pSVar20->in_directory).d.ptr;
    local_2a8.m_string.d.size = (pSVar20->in_directory).d.size;
    if ((SubTarget *)local_2a8.m_string.d.d != (SubTarget *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(((SubTarget *)local_2a8.m_string.d.d)->name).d.d)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(((SubTarget *)local_2a8.m_string.d.d)->name).d.d)->_q_value).
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (((SubTarget *)local_2a8.m_string.d.size != (SubTarget *)0x0) &&
       (cVar12 = QString::endsWith((QString *)&local_2a8,0x26bbd0), cVar12 == '\0')) {
      QString::append((QString *)&local_2a8);
    }
    local_118.d = (pSVar20->out_directory).d.d;
    local_118.ptr = (pSVar20->out_directory).d.ptr;
    local_118.size = (pSVar20->out_directory).d.size;
    if ((QArrayDataPointer<ProString> *)local_118.d != (QArrayDataPointer<ProString> *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayDataPointer<ProString> *)local_118.d)->d)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayDataPointer<ProString> *)local_118.d)->d)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (((SourceFiles *)local_118.size != (SourceFiles *)0x0) &&
       (cVar12 = QString::endsWith((QString *)&local_118,0x26bbd0), cVar12 == '\0')) {
      QString::append((QString *)&local_118);
    }
    if ((local_c8.size != 0) &&
       (cVar12 = QString::startsWith((QString *)&local_118,(CaseSensitivity)&local_c8),
       cVar12 != '\0')) {
      QString::mid((longlong)&local_138,(longlong)&local_118);
      qVar19 = local_138.size;
      rkey.super_ProString.m_string.d.size = (qsizetype)local_138.ptr;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)local_138.d;
      rkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
      local_138.d = (Data *)0x0;
      local_138.ptr = (char16_t *)0x0;
      local_138.size = 0;
      qVar5 = local_138.size;
      local_138.size._0_4_ = (undefined4)qVar19;
      local_138.size._4_4_ = SUB84(qVar19,4);
      rkey.super_ProString.m_offset = (undefined4)local_138.size;
      rkey.super_ProString.m_length = local_138.size._4_4_;
      local_138.size = qVar5;
      QStringBuilder<QString_&,_QString>::convertTo<QString>
                ((QString *)&rtkey,(QStringBuilder<QString_&,_QString> *)&rkey);
      qVar19 = local_118.size;
      pcVar10 = local_118.ptr;
      pDVar23 = local_118.d;
      local_118.d = rtkey.super_ProString.m_string.d.d;
      local_118.ptr = rtkey.super_ProString.m_string.d.ptr;
      rtkey.super_ProString.m_string.d.d = pDVar23;
      rtkey.super_ProString.m_string.d.ptr = pcVar10;
      local_118.size = rtkey.super_ProString.m_string.d.size;
      rtkey.super_ProString.m_string.d.size = qVar19;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&rkey.super_ProString.m_string.d.ptr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    }
    local_138.size = -0x5555555555555556;
    local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_138.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    if ((SourceFiles *)local_118.size == (SourceFiles *)0x0) {
      QString::QString((QString *)&local_138,"\n\t");
    }
    else {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                (&local_158,this,&local_118);
      qVar19 = local_158.size;
      rtkey.super_ProString.m_string.d.size = (qsizetype)local_158.ptr;
      rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_158.d;
      rtkey.super_ProString.m_string.d.d = (Data *)anon_var_dwarf_c5446;
      local_158.d = (Data *)0x0;
      local_158.ptr = (char16_t *)0x0;
      local_158.size = 0;
      qVar5 = local_158.size;
      local_158.size._0_4_ = (undefined4)qVar19;
      local_158.size._4_4_ = SUB84(qVar19,4);
      rtkey.super_ProString.m_offset = (undefined4)local_158.size;
      rtkey.super_ProString.m_length = local_158.size._4_4_;
      local_158.size = qVar5;
      QStringBuilder<const_char_(&)[6],_QString>::QStringBuilder
                ((QStringBuilder<const_char_(&)[6],_QString> *)&rkey,
                 (QStringBuilder<const_char_(&)[6],_QString> *)&rtkey);
      rkey.super_ProString._32_8_ = (long)" ) && " + 2;
      QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
      convertTo<QString>((QString *)&local_138,
                         (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                          *)&rkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&rkey.super_ProString.m_string.d.ptr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&rtkey.super_ProString.m_string.d.ptr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    }
    rtkey.super_ProString.m_string.d.size = -0x5555555555555556;
    rtkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    rtkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_158,this);
    qVar19 = local_158.size;
    rkey.super_ProString.m_string.d.size = (qsizetype)local_158.ptr;
    rkey.super_ProString.m_string.d.ptr = (char16_t *)local_158.d;
    rkey.super_ProString.m_string.d.d = (Data *)0x21c7be;
    local_158.d = (Data *)0x0;
    local_158.ptr = (char16_t *)0x0;
    local_158.size = 0;
    qVar5 = local_158.size;
    local_158.size._0_4_ = (undefined4)qVar19;
    local_158.size._4_4_ = SUB84(qVar19,4);
    rkey.super_ProString.m_offset = (undefined4)local_158.size;
    rkey.super_ProString.m_length = local_158.size._4_4_;
    local_158.size = qVar5;
    QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
              ((QString *)&rtkey,(QStringBuilder<const_char_(&)[5],_QString> *)&rkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&rkey.super_ProString.m_string.d.ptr);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    rkey.super_ProString.m_string.d.size = 0;
    local_158.size = 0;
    rkey.super_ProString.m_string.d.d = (Data *)0x0;
    rkey.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_158.d = (Data *)0x0;
    local_158.ptr = (char16_t *)0x0;
    if ((pSVar20->profile).d.size != 0) {
      QString::operator=((QString *)&rkey,(QString *)&pSVar20->makefile);
      local_1b8.d = (Data *)&local_2a8;
      local_1b8.ptr = (ProString *)&pSVar20->profile;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                ((QString *)&local_198,(QStringBuilder<QString_&,_QString_&> *)&local_1b8);
      fileFixify((QString *)&local_58,this,(QString *)&local_198,(FileFixifyTypes)0x4,true);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_178,this,&local_58)
      ;
      qVar19 = local_158.size;
      pcVar10 = local_158.ptr;
      pDVar23 = local_158.d;
      local_158.d = (Data *)local_178.d;
      local_158.ptr = (char16_t *)local_178.ptr;
      local_178.d = (Data *)pDVar23;
      local_178.ptr = (ProString *)pcVar10;
      local_158.size = local_178.size;
      local_178.size = qVar19;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
      cVar12 = QString::startsWith((QString *)&rkey,(CaseSensitivity)&local_2a8);
      if (cVar12 != '\0') {
        QString::mid((longlong)&local_178,(longlong)&rkey);
        qVar19 = rkey.super_ProString.m_string.d.size;
        pcVar10 = rkey.super_ProString.m_string.d.ptr;
        pDVar23 = rkey.super_ProString.m_string.d.d;
        rkey.super_ProString.m_string.d.d = (Data *)local_178.d;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)local_178.ptr;
        local_178.d = (Data *)pDVar23;
        local_178.ptr = (ProString *)pcVar10;
        rkey.super_ProString.m_string.d.size = local_178.size;
        local_178.size = qVar19;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      }
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_178,this,&rkey);
      qVar19 = rkey.super_ProString.m_string.d.size;
      pcVar10 = rkey.super_ProString.m_string.d.ptr;
      pDVar23 = rkey.super_ProString.m_string.d.d;
      rkey.super_ProString.m_string.d.d = (Data *)local_178.d;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)local_178.ptr;
      local_178.d = (Data *)pDVar23;
      local_178.ptr = (ProString *)pcVar10;
      rkey.super_ProString.m_string.d.size = local_178.size;
      local_178.size = qVar19;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&pSVar20->target);
      QTextStream::operator<<(pQVar15,"-qmake_all: ");
      if ((in_ECX & 2) == 0) {
        if ((pSVar20->depends).super_QList<ProString>.d.size != 0) {
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          local_58.size = 0;
          QString::QString((QString *)&local_198,"-qmake_all ");
          pcVar24 = "-qmake_all";
          QString::QString((QString *)&local_1b8,"-qmake_all");
          valGlue((QString *)&local_178,(MakefileGenerator *)pcVar24,&pSVar20->depends,
                  (QString *)&local_58,(QString *)&local_198,(QString *)&local_1b8);
          QTextStream::operator<<(t,(QString *)&local_178);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        }
      }
      else if (uVar27 != 0) {
        pQVar15 = (QTextStream *)
                  QTextStream::operator<<(t,(QString *)&(this_01->d).ptr[uVar27 - 1]->target);
        QTextStream::operator<<(pQVar15,"-qmake_all");
      }
      QTextStream::operator<<(t," FORCE\n\t");
      if ((SubTarget *)local_2a8.m_string.d.size != (SubTarget *)0x0) {
        mkdir_p_asstring((QString *)&local_178,this,(QString *)&local_118,true);
        pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_178);
        QTextStream::operator<<(pQVar15,(QString *)&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      }
      pQVar15 = (QTextStream *)QTextStream::operator<<(t,"$(QMAKE) -o ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&rkey);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,' ');
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_158);
      buildArgs((QString *)&local_178,this,false);
      QTextStream::operator<<(pQVar15,(QString *)&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      if (bVar28) {
        Qt::endl(t);
      }
      else {
        local_58.d = (Data *)&rtkey;
        local_58.ptr = L" qmake_all";
        QStringBuilder<QString_&,_const_char_(&)[11]>::convertTo<QString>
                  ((QString *)&local_178,(QStringBuilder<QString_&,_const_char_(&)[11]> *)&local_58)
        ;
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[8])
                  (this,t,&local_138,&local_178);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      }
    }
    pQVar1 = &pSVar20->target;
    pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar1);
    QTextStream::operator<<(pQVar15,":");
    local_178.size = -0x5555555555555556;
    local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_178.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[10])(&local_178,this);
    if ((SubTarget *)local_178.size != (SubTarget *)0x0) {
      pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
      valList((QString *)&local_58,this,(ProStringList *)&local_178);
      QTextStream::operator<<(pQVar15,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    if ((pSVar20->depends).super_QList<ProString>.d.size != 0) {
      pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
      valList((QString *)&local_58,this,&pSVar20->depends);
      QTextStream::operator<<(pQVar15,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    QTextStream::operator<<(t," FORCE");
    writeSubTargetCall(this,t,&local_2a8.m_string,(QString *)&local_158,(QString *)&local_118,
                       (QString *)&rkey,(QString *)&local_138,(QString *)&rtkey);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_178);
    for (pDVar23 = (Data *)0x0; pDVar23 < (ulong)local_a8.size;
        pDVar23 = (Data *)((long)&(pDVar23->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                  ._M_i + 1)) {
      local_178.d = (Data *)local_a8.ptr[(long)pDVar23].d.d;
      local_178.ptr = (ProString *)local_a8.ptr[(long)pDVar23].d.ptr;
      local_178.size = local_a8.ptr[(long)pDVar23].d.size;
      if ((SubTarget *)local_178.d != (SubTarget *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(((SubTarget *)local_178.d)->name).d.d)->_q_value).
        super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(((SubTarget *)local_178.d)->name).d.d)->_q_value).
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar13 = comparesEqual((QString *)&local_178,"install_subtargets");
      if (bVar13) {
        QString::operator=((QString *)&local_178,"install");
      }
      else {
        bVar13 = comparesEqual((QString *)&local_178,"uninstall_subtargets");
        if (bVar13) {
          QString::operator=((QString *)&local_178,"uninstall");
        }
        else {
          bVar13 = comparesEqual((QString *)&local_178,"make_first");
          qVar19 = local_178.size;
          pPVar22 = local_178.ptr;
          pDVar11 = local_178.d;
          if (bVar13) {
            local_178.d = (Data *)0x0;
            local_178.ptr = (ProString *)0x0;
            local_58.d = (Data *)pDVar11;
            local_58.ptr = (char16_t *)pPVar22;
            local_178.size = 0;
            local_58.size = qVar19;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          }
        }
      }
      pQVar4 = this->project;
      QString::QString((QString *)&local_58,"build_all");
      bVar13 = QMakeProject::isActiveConfig(pQVar4,(QString *)&local_58,false);
      if (bVar13) {
        bVar13 = comparesEqual((QString *)&local_178,"install");
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (bVar13) {
          if (this_00 == (default_delete<SequentialInstallData> *)0x0) {
            this_00 = (default_delete<SequentialInstallData> *)operator_new(0x40);
            *(undefined8 *)this_00 = 0;
            *(undefined8 *)(this_00 + 8) = 0;
            *(undefined8 *)(this_00 + 0x10) = 0;
            *(undefined8 *)(this_00 + 0x18) = 0;
            *(undefined8 *)(this_00 + 0x20) = 0;
            *(undefined8 *)(this_00 + 0x28) = 0;
            QTextStream::QTextStream((QTextStream *)(this_00 + 0x30),this_00 + 0x18,3);
          }
          local_58.ptr = (char16_t *)CONCAT71(local_58.ptr._1_7_,0x2d);
          local_58.d = (Data *)pQVar1;
          ::operator+=((QString *)this_00,(QStringBuilder<QString_&,_char> *)&local_58);
          local_198.d = (Data *)&rtkey;
          local_198.ptr = L" ";
          local_198.size = (qsizetype)&local_178;
          QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
          convertTo<QString>((QString *)&local_58,
                             (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                              *)&local_198);
          writeSubTargetCall(this,(QTextStream *)(this_00 + 0x30),&local_2a8.m_string,
                             (QString *)&local_158,(QString *)&local_118,(QString *)&rkey,
                             (QString *)&local_138,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          while ((*(long *)(this_00 + 0x28) != 0 &&
                 ((sVar3 = *(short *)(*(long *)(this_00 + 0x20) + -2 + *(long *)(this_00 + 0x28) * 2
                                     ), sVar3 == 0xd || (sVar3 == 10))))) {
            QString::chop((longlong)(this_00 + 0x18));
          }
        }
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      if ((in_ECX & 2) != 0) {
        pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar1);
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"-");
        pQVar15 = (QTextStream *)
                  QTextStream::operator<<(pQVar15,(QString *)(local_a8.ptr + (long)pDVar23));
        QTextStream::operator<<(pQVar15,"-ordered:");
        if (uVar27 != 0) {
          pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<
                              (pQVar15,(QString *)&(this_01->d).ptr[uVar27 - 1]->target);
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"-");
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<(pQVar15,(QString *)(local_a8.ptr + (long)pDVar23));
          QTextStream::operator<<(pQVar15,"-ordered ");
        }
        QTextStream::operator<<(t," FORCE");
        local_198.d = (Data *)&rtkey;
        local_198.ptr = L" ";
        local_198.size = (qsizetype)&local_178;
        QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::convertTo<QString>
                  ((QString *)&local_58,
                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                   &local_198);
        writeSubTargetCall(this,t,&local_2a8.m_string,(QString *)&local_158,(QString *)&local_118,
                           (QString *)&rkey,(QString *)&local_138,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar1);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"-");
      pQVar15 = (QTextStream *)
                QTextStream::operator<<(pQVar15,(QString *)(local_a8.ptr + (long)pDVar23));
      QTextStream::operator<<(pQVar15,":");
      if ((pSVar20->depends).super_QList<ProString>.d.size != 0) {
        pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
        local_198.d = (Data *)0x0;
        local_198.ptr = (char16_t *)0x0;
        local_198.size = 0;
        local_1d8.ptr = (char16_t *)(local_a8.ptr + (long)pDVar23);
        local_1d8.d = (Data *)0x21c57f;
        local_1d8.size = 0x21fe9e;
        QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]>::
        convertTo<QString>((QString *)&local_1b8,
                           (QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]>
                            *)&local_1d8);
        local_218._8_8_ = local_a8.ptr + (long)pDVar23;
        local_218._0_8_ = "-";
        pQVar2 = (QArrayDataPointer<char16_t> *)(local_200 + 8);
        pMVar25 = (MakefileGenerator *)local_218;
        QStringBuilder<const_char_(&)[2],_const_QString_&>::convertTo<QString>
                  ((QString *)pQVar2,(QStringBuilder<const_char_(&)[2],_const_QString_&> *)pMVar25);
        valGlue((QString *)&local_58,pMVar25,&pSVar20->depends,(QString *)&local_198,
                (QString *)&local_1b8,(QString *)pQVar2);
        QTextStream::operator<<(pQVar15,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
      }
      QTextStream::operator<<(t," FORCE");
      local_198.d = (Data *)&rtkey;
      local_198.ptr = L" ";
      local_198.size = (qsizetype)&local_178;
      QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::convertTo<QString>
                ((QString *)&local_58,
                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                 &local_198);
      writeSubTargetCall(this,t,&local_2a8.m_string,(QString *)&local_158,(QString *)&local_118,
                         (QString *)&rkey,(QString *)&local_138,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
  }
  Qt::endl(t);
  if (this_00 != (default_delete<SequentialInstallData> *)0x0) {
    pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)this_00);
    pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"install: FORCE");
    pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)(this_00 + 0x18));
    pQVar15 = (QTextStream *)Qt::endl(pQVar15);
    Qt::endl(pQVar15);
  }
  if ((in_ECX & 8) == 0) {
    writeMakeQmake(this,t,true);
    QTextStream::operator<<(t,"qmake_all:");
    if ((this_01->d).size != 0) {
      for (iVar16 = QList<MakefileGenerator::SubTarget_*>::begin(this_01);
          iVar17 = QList<MakefileGenerator::SubTarget_*>::end(this_01), iVar16.i != iVar17.i;
          iVar16.i = iVar16.i + 1) {
        if (((*iVar16.i)->profile).d.size != 0) {
          pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&(*iVar16.i)->target);
          QTextStream::operator<<(pQVar15,"-qmake_all");
        }
      }
    }
    QTextStream::operator<<(t," FORCE\n\n");
  }
  pDVar23 = (Data *)0x0;
  do {
    if ((ulong)local_a8.size <= pDVar23) {
      pQVar4 = this->project;
      ProKey::ProKey(&rkey,"QMAKE_EXTRA_TARGETS");
      pPVar14 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
      pSVar20 = (SubTarget *)(pPVar14->super_QList<ProString>).d.ptr;
      for (this_02 = pSVar20;
          this_02 != (SubTarget *)(&pSVar20->name + (pPVar14->super_QList<ProString>).d.size * 2);
          this_02 = (SubTarget *)&this_02->out_directory) {
        pQVar4 = this->project;
        rtkey.super_ProString.m_string.d.ptr = L".CONFIG";
        rtkey.super_ProString.m_string.d.d = (Data *)this_02;
        ProString::ProString<ProString_const&,char_const(&)[8]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
        pQVar18 = &QMakeEvaluator::valuesRef
                             (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                   super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        local_118.size = -0x5555555555555556;
        local_118.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_118.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        rtkey.super_ProString.m_string.d.ptr = L".target";
        rtkey.super_ProString.m_string.d.d = (Data *)this_02;
        ProString::ProString<ProString_const&,char_const(&)[8]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                  (&local_118,this,&rkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        local_138.size = -0x5555555555555556;
        local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_138.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        rtkey.super_ProString.m_string.d.ptr = L".commands";
        rtkey.super_ProString.m_string.d.d = (Data *)this_02;
        ProString::ProString<ProString_const&,char_const(&)[10]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&rtkey);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                  (&local_138,this,&rkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        local_158.size = 0;
        local_158.d = (Data *)0x0;
        local_158.ptr = (char16_t *)0x0;
        if ((SourceFiles *)local_118.size == (SourceFiles *)0x0) {
          ProString::toQString(&rkey.super_ProString.m_string,(ProString *)this_02);
          qVar19 = local_118.size;
          pcVar10 = local_118.ptr;
          pDVar23 = local_118.d;
          local_118.d = rkey.super_ProString.m_string.d.d;
          local_118.ptr = rkey.super_ProString.m_string.d.ptr;
          rkey.super_ProString.m_string.d.d = pDVar23;
          rkey.super_ProString.m_string.d.ptr = pcVar10;
          local_118.size = rkey.super_ProString.m_string.d.size;
          rkey.super_ProString.m_string.d.size = qVar19;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        }
        Qt::endl(t);
        pQVar4 = this->project;
        rtkey.super_ProString.m_string.d.ptr = L".depends";
        rtkey.super_ProString.m_string.d.d = (Data *)this_02;
        ProString::ProString<ProString_const&,char_const(&)[9]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
        pPVar21 = QMakeEvaluator::valuesRef
                            (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        pPVar22 = (pPVar21->super_QList<ProString>).d.ptr;
        for (pPVar26 = pPVar22; pPVar26 != pPVar22 + (pPVar21->super_QList<ProString>).d.size;
            pPVar26 = pPVar26 + 1) {
          rtkey.super_ProString.m_string.d.size = -0x5555555555555556;
          rtkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_2a8.m_string.d.ptr = L".target";
          local_2a8.m_string.d.d = (Data *)pPVar26;
          ProString::ProString<ProString_const&,char_const(&)[8]>
                    (&rkey.super_ProString,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_2a8);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    ((QArrayDataPointer<QString> *)&rtkey,this,&rkey.super_ProString);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
          if (rtkey.super_ProString.m_string.d.size == 0) {
            ProString::toQString(&rkey.super_ProString.m_string,pPVar26);
            qVar19 = rtkey.super_ProString.m_string.d.size;
            pcVar10 = rtkey.super_ProString.m_string.d.ptr;
            pDVar23 = rtkey.super_ProString.m_string.d.d;
            rtkey.super_ProString.m_string.d.d = rkey.super_ProString.m_string.d.d;
            rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
            rkey.super_ProString.m_string.d.d = pDVar23;
            rkey.super_ProString.m_string.d.ptr = pcVar10;
            rtkey.super_ProString.m_string.d.size = rkey.super_ProString.m_string.d.size;
            rkey.super_ProString.m_string.d.size = qVar19;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
          }
          Option::fixPathToTargetOS((QString *)&local_178,(QString *)&rtkey,false,true);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (&local_2a8,this,&local_178);
          qVar19 = local_2a8.m_string.d.size;
          rkey.super_ProString.m_string.d.size = (qsizetype)local_2a8.m_string.d.ptr;
          rkey.super_ProString.m_string.d.ptr = (char16_t *)local_2a8.m_string.d.d;
          rkey.super_ProString.m_string.d.d =
               (Data *)CONCAT71(rkey.super_ProString.m_string.d.d._1_7_,0x20);
          local_2a8.m_string.d.d = (Data *)0x0;
          local_2a8.m_string.d.ptr = (char16_t *)0x0;
          local_2a8.m_string.d.size = 0;
          qVar5 = local_2a8.m_string.d.size;
          local_2a8.m_string.d.size._0_4_ = (undefined4)qVar19;
          local_2a8.m_string.d.size._4_4_ = SUB84(qVar19,4);
          rkey.super_ProString.m_offset = (undefined4)local_2a8.m_string.d.size;
          rkey.super_ProString.m_length = local_2a8.m_string.d.size._4_4_;
          local_2a8.m_string.d.size = qVar5;
          ::operator+=((QString *)&local_158,(QStringBuilder<char,_QString> *)&rkey.super_ProString)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString.m_string.d.ptr);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
          pPVar22 = (pPVar21->super_QList<ProString>).d.ptr;
        }
        qVar19 = QtPrivate::indexOf<ProString,char[10]>(pQVar18,(char (*) [10])0x226b52,0);
        if (qVar19 != -1) {
          local_200._0_8_ = (Data *)0x0;
          rkey.super_ProString.m_file = -0x55555556;
          rkey.super_ProString._36_4_ = 0xaaaaaaaa;
          rkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
          rkey.super_ProString.m_string.d.size = -0x5555555555555556;
          rkey.super_ProString.m_offset = -0x55555556;
          rkey.super_ProString.m_length = -0x55555556;
          rkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          rkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = L".recurse";
          rtkey.super_ProString.m_string.d.d = (Data *)this_02;
          ProString::ProString<ProString_const&,char_const(&)[9]>
                    (&rkey.super_ProString,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
          bVar28 = QMakeProject::isSet(this->project,(ProKey *)&rkey.super_ProString);
          if (bVar28) {
            rtkey.super_ProString.m_string.d.size = -0x5555555555555556;
            rtkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            rtkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            pPVar21 = QMakeEvaluator::valuesRef
                                (&this->project->super_QMakeEvaluator,
                                 (ProKey *)&rkey.super_ProString);
            ProStringList::toQStringList((QStringList *)&rtkey,pPVar21);
            QSet<QString>::QSet<QList<QString>::const_iterator,_true>
                      ((QSet<QString> *)&local_2a8,
                       (const_iterator)rtkey.super_ProString.m_string.d.ptr,
                       (QString *)
                       (rtkey.super_ProString.m_string.d.ptr +
                       rtkey.super_ProString.m_string.d.size * 0xc));
            QHash<QString,_QHashDummyValue>::operator=
                      ((QHash<QString,_QHashDummyValue> *)local_200,
                       (QHash<QString,_QHashDummyValue> *)&local_2a8);
            QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)&local_2a8);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&rtkey);
          }
          else {
            for (uVar27 = 0; uVar27 < (ulong)(this_01->d).size; uVar27 = uVar27 + 1) {
              QSet<QString>::insert((QSet<QString> *)&rtkey,(QString *)local_200);
            }
          }
          uVar27 = 0;
          while( true ) {
            if ((ulong)(this_01->d).size <= uVar27) break;
            pSVar20 = (this_01->d).ptr[uVar27];
            local_178.d = (Data *)(pSVar20->in_directory).d.d;
            local_178.ptr = (ProString *)(pSVar20->in_directory).d.ptr;
            local_178.size = (pSVar20->in_directory).d.size;
            if ((SubTarget *)local_178.d != (SubTarget *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(((SubTarget *)local_178.d)->name).d.d)->_q_value).
              super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(((SubTarget *)local_178.d)->name).d.d)->_q_value).
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (((SubTarget *)local_178.size != (SubTarget *)0x0) &&
               (cVar12 = QString::endsWith((QString *)&local_178,0x26bbd0), cVar12 == '\0')) {
              QString::append((QString *)&local_178);
            }
            local_58.d = (pSVar20->out_directory).d.d;
            local_58.ptr = (pSVar20->out_directory).d.ptr;
            local_58.size = (pSVar20->out_directory).d.size;
            if ((SubTarget *)local_58.d != (SubTarget *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(((SubTarget *)local_58.d)->name).d.d)->_q_value).
              super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(((SubTarget *)local_58.d)->name).d.d)->_q_value).
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (((SubTarget *)local_58.size != (SubTarget *)0x0) &&
               (cVar12 = QString::endsWith((QString *)&local_58,0x26bbd0), cVar12 == '\0')) {
              QString::append((QString *)&local_58);
            }
            if ((local_c8.size != 0) &&
               (cVar12 = QString::startsWith((QString *)&local_58,(CaseSensitivity)&local_c8),
               cVar12 != '\0')) {
              QString::mid((longlong)&local_198,(longlong)&local_58);
              qVar19 = local_198.size;
              rtkey.super_ProString.m_string.d.size = (qsizetype)local_198.ptr;
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_198.d;
              rtkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
              local_198.d = (Data *)0x0;
              local_198.ptr = (char16_t *)0x0;
              local_198.size = 0;
              qVar5 = local_198.size;
              local_198.size._0_4_ = (undefined4)qVar19;
              local_198.size._4_4_ = SUB84(qVar19,4);
              rtkey.super_ProString.m_offset = (undefined4)local_198.size;
              rtkey.super_ProString.m_length = local_198.size._4_4_;
              local_198.size = qVar5;
              QStringBuilder<QString_&,_QString>::convertTo<QString>
                        (&local_2a8.m_string,(QStringBuilder<QString_&,_QString> *)&rtkey);
              qVar19 = local_58.size;
              pcVar10 = local_58.ptr;
              pDVar23 = local_58.d;
              local_58.d = local_2a8.m_string.d.d;
              local_58.ptr = local_2a8.m_string.d.ptr;
              local_2a8.m_string.d.d = pDVar23;
              local_2a8.m_string.d.ptr = pcVar10;
              local_58.size = local_2a8.m_string.d.size;
              local_2a8.m_string.d.size = qVar19;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&rtkey.super_ProString.m_string.d.ptr);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
            }
            bVar28 = QHash<QString,_QHashDummyValue>::contains
                               ((QHash<QString,_QHashDummyValue> *)local_200,&pSVar20->name);
            if (bVar28) {
              local_198.size = -0x5555555555555556;
              local_198.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_198.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              if ((SubTarget *)local_58.size == (SubTarget *)0x0) {
                QString::QString((QString *)&local_198,"\n\t");
              }
              else {
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_1b8,this,&local_58);
                qVar19 = local_1b8.size;
                local_2a8.m_string.d.size = (qsizetype)local_1b8.ptr;
                local_2a8.m_string.d.ptr = (char16_t *)local_1b8.d;
                local_2a8.m_string.d.d = (Data *)0x21b3de;
                local_1b8.d = (Data *)0x0;
                local_1b8.ptr = (ProString *)0x0;
                local_1b8.size = 0;
                qVar5 = local_1b8.size;
                local_1b8.size._0_4_ = (undefined4)qVar19;
                local_1b8.size._4_4_ = SUB84(qVar19,4);
                local_2a8.m_offset = (undefined4)local_1b8.size;
                local_2a8.m_length = local_1b8.size._4_4_;
                local_1b8.size = qVar5;
                QStringBuilder<const_char_(&)[6],_QString>::QStringBuilder
                          ((QStringBuilder<const_char_(&)[6],_QString> *)&rtkey,
                           (QStringBuilder<const_char_(&)[6],_QString> *)&local_2a8);
                rtkey.super_ProString._32_8_ = (long)" ) && " + 2;
                QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
                convertTo<QString>((QString *)&local_198,
                                   (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                                    *)&rtkey);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rtkey.super_ProString.m_string.d.ptr);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_2a8.m_string.d.ptr);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_1b8);
              }
              local_1b8.size = -0x5555555555555556;
              local_1b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_1b8.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&local_2a8,this,&pSVar20->makefile);
              qVar19 = local_2a8.m_string.d.size;
              rtkey.super_ProString.m_string.d.size = (qsizetype)local_2a8.m_string.d.ptr;
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_2a8.m_string.d.d;
              rtkey.super_ProString.m_string.d.d = (Data *)0x21c7be;
              local_2a8.m_string.d.d = (Data *)0x0;
              local_2a8.m_string.d.ptr = (char16_t *)0x0;
              local_2a8.m_string.d.size = 0;
              qVar5 = local_2a8.m_string.d.size;
              local_2a8.m_string.d.size._0_4_ = (undefined4)qVar19;
              local_2a8.m_string.d.size._4_4_ = SUB84(qVar19,4);
              rtkey.super_ProString.m_offset = (undefined4)local_2a8.m_string.d.size;
              rtkey.super_ProString.m_length = local_2a8.m_string.d.size._4_4_;
              local_2a8.m_string.d.size = qVar5;
              QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
                        ((QString *)&local_1b8,(QStringBuilder<const_char_(&)[5],_QString> *)&rtkey)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&rtkey.super_ProString.m_string.d.ptr);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2a8);
              local_1d8.size = 0;
              local_1e8 = (char16_t *)0x0;
              local_1d8.d = (Data *)0x0;
              local_1d8.ptr = (char16_t *)0x0;
              local_200._8_8_ = (Data *)0x0;
              pQStack_1f0 = (QMakeLocalFileName *)0x0;
              if ((pSVar20->profile).d.size != 0) {
                QString::operator=((QString *)&local_1d8,(QString *)&pSVar20->makefile);
                local_238.d = (Data *)&local_178;
                local_238.ptr = (char16_t *)&pSVar20->profile;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          ((QString *)local_218,(QStringBuilder<QString_&,_QString_&> *)&local_238);
                fileFixify(&local_2a8.m_string,this,(QString *)local_218,(FileFixifyTypes)0x4,true);
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          ((QStringBuilder<const_char_(&)[5],_QString> *)&rtkey,this,&local_2a8);
                pcVar10 = local_1e8;
                pQVar9 = pQStack_1f0;
                uVar6 = local_200._8_8_;
                local_200._8_8_ = rtkey.super_ProString.m_string.d.d;
                pQStack_1f0 = (QMakeLocalFileName *)rtkey.super_ProString.m_string.d.ptr;
                rtkey.super_ProString.m_string.d.d = (Data *)uVar6;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)pQVar9;
                local_1e8 = (char16_t *)rtkey.super_ProString.m_string.d.size;
                rtkey.super_ProString.m_string.d.size = (qsizetype)pcVar10;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rtkey);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_2a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_218);
                cVar12 = QString::startsWith((QString *)&local_1d8,(CaseSensitivity)&local_178);
                if (cVar12 != '\0') {
                  QString::mid((longlong)&rtkey,(longlong)&local_1d8);
                  qVar19 = local_1d8.size;
                  pcVar10 = local_1d8.ptr;
                  pDVar23 = local_1d8.d;
                  local_1d8.d = rtkey.super_ProString.m_string.d.d;
                  local_1d8.ptr = rtkey.super_ProString.m_string.d.ptr;
                  rtkey.super_ProString.m_string.d.d = pDVar23;
                  rtkey.super_ProString.m_string.d.ptr = pcVar10;
                  local_1d8.size = rtkey.super_ProString.m_string.d.size;
                  rtkey.super_ProString.m_string.d.size = qVar19;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&rtkey);
                }
                (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          ((QStringBuilder<const_char_(&)[5],_QString> *)&rtkey,this,&local_1d8);
                qVar19 = local_1d8.size;
                pcVar10 = local_1d8.ptr;
                pDVar23 = local_1d8.d;
                local_1d8.d = rtkey.super_ProString.m_string.d.d;
                local_1d8.ptr = rtkey.super_ProString.m_string.d.ptr;
                rtkey.super_ProString.m_string.d.d = pDVar23;
                rtkey.super_ProString.m_string.d.ptr = pcVar10;
                local_1d8.size = rtkey.super_ProString.m_string.d.size;
                rtkey.super_ProString.m_string.d.size = qVar19;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rtkey);
              }
              if ((in_ECX & 2) == 0) {
                rtkey.super_ProString.m_string.d.size = -0x5555555555555556;
                rtkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                local_2a8.m_string.d.ptr = L"-";
                local_2a8.m_string.d.d = (Data *)&pSVar20->target;
                local_2a8.m_string.d.size = (qsizetype)this_02;
                QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>::
                convertTo<QString>((QString *)&rtkey,
                                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>
                                    *)&local_2a8);
                pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&rtkey);
                QTextStream::operator<<(pQVar15,":");
                if ((pSVar20->depends).super_QList<ProString>.d.size != 0) {
                  pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
                  local_218._16_8_ = (SourceFiles *)0x0;
                  local_218._0_8_ = (QArrayDataPointer<ProString> *)0x0;
                  local_218._8_8_ = (SourceFiles *)0x0;
                  local_250.a.a = (char (*) [2])0x21c57f;
                  local_250.b = (char (*) [2])0x21fe9e;
                  local_250.a.b = (ProString *)this_02;
                  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]>
                  ::convertTo<QString>((QString *)&local_238,&local_250);
                  local_278._0_8_ = "-";
                  pQVar2 = (QArrayDataPointer<char16_t> *)(local_278 + 0x10);
                  pMVar25 = (MakefileGenerator *)local_278;
                  local_278._8_8_ = this_02;
                  QStringBuilder<const_char_(&)[2],_const_ProString_&>::convertTo<QString>
                            ((QString *)pQVar2,
                             (QStringBuilder<const_char_(&)[2],_const_ProString_&> *)pMVar25);
                  valGlue(&local_2a8.m_string,pMVar25,&pSVar20->depends,(QString *)local_218,
                          (QString *)&local_238,(QString *)pQVar2);
                  QTextStream::operator<<(pQVar15,(QString *)&local_2a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_2a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar2);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_238);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_218);
                }
                local_2a8.m_string.d.d = (Data *)0x21fe9e;
                local_2a8.m_string.d.ptr = (char16_t *)&rtkey;
                ::operator+=((QString *)&local_158,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&local_2a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&rtkey);
              }
              else {
                local_2a8.m_string.d.size = -0x5555555555555556;
                local_2a8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_2a8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.ptr = L"-";
                rtkey.super_ProString._24_8_ = anon_var_dwarf_c5564;
                rtkey.super_ProString.m_string.d.d = (Data *)&pSVar20->target;
                rtkey.super_ProString.m_string.d.size = (qsizetype)this_02;
                QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                ::convertTo<QString>
                          (&local_2a8.m_string,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                            *)&rtkey);
                pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_2a8);
                QTextStream::operator<<(pQVar15,":");
                if (uVar27 != 0) {
                  pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
                  pQVar15 = (QTextStream *)
                            QTextStream::operator<<
                                      (pQVar15,(QString *)&(this_01->d).ptr[uVar27 - 1]->target);
                  pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"-");
                  pQVar15 = operator<<(pQVar15,(ProString *)this_02);
                  QTextStream::operator<<(pQVar15,"_ordered ");
                }
                rtkey.super_ProString.m_string.d.d = (Data *)0x21fe9e;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)&local_2a8;
                ::operator+=((QString *)&local_158,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&rtkey);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_2a8);
              }
              local_218._0_8_ = local_118.d;
              local_218._8_8_ = local_118.ptr;
              local_218._16_8_ = local_118.size;
              if ((QArrayDataPointer<ProString> *)local_118.d != (QArrayDataPointer<ProString> *)0x0
                 ) {
                LOCK();
                ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              rtkey.super_ProString.m_file = -0x55555556;
              rtkey.super_ProString._36_4_ = 0xaaaaaaaa;
              rtkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.size = -0x5555555555555556;
              rtkey.super_ProString.m_offset = -0x55555556;
              rtkey.super_ProString.m_length = -0x55555556;
              rtkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_2a8.m_string.d.ptr = L".recurse_target";
              local_2a8.m_string.d.d = (Data *)this_02;
              ProString::ProString<ProString_const&,char_const(&)[16]>
                        (&rtkey.super_ProString,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[16]> *)&local_2a8);
              bVar28 = QMakeProject::isSet(this->project,(ProKey *)&rtkey.super_ProString);
              if (bVar28) {
                QMakeEvaluator::first
                          (&local_2a8,&this->project->super_QMakeEvaluator,
                           (ProKey *)&rtkey.super_ProString);
                ProString::toQString((QString *)&local_238,&local_2a8);
                uVar8 = local_218._16_8_;
                uVar7 = local_218._8_8_;
                uVar6 = local_218._0_8_;
                local_218._0_8_ = local_238.d;
                local_218._8_8_ = local_238.ptr;
                local_238.d = (Data *)uVar6;
                local_238.ptr = (char16_t *)uVar7;
                local_218._16_8_ = local_238.size;
                local_238.size = uVar8;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_238);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_2a8);
              }
              local_238.ptr = L" ";
              local_238.size = (qsizetype)local_218;
              local_238.d = (Data *)&local_1b8;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>(&local_2a8.m_string,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                                  *)&local_238);
              writeSubTargetCall(this,t,(QString *)&local_178,(QString *)(local_200 + 8),
                                 (QString *)&local_58,(QString *)&local_1d8,(QString *)&local_198,
                                 &local_2a8.m_string);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_218);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_200 + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_178);
            uVar27 = uVar27 + 1;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
          QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)local_200);
        }
        qVar19 = QtPrivate::indexOf<ProString,char[6]>(pQVar18,(char (*) [6])"phony",0);
        if (qVar19 != -1) {
          QString::operator+=((QString *)&local_158," FORCE");
        }
        Option::fixPathToTargetOS((QString *)&rtkey,(QString *)&local_118,false,true);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                  ((QArrayDataPointer<char16_t> *)&rkey,this,(QArrayDataPointer<char16_t> *)&rtkey);
        pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&rkey);
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,":");
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_158);
        QTextStream::operator<<(pQVar15,"\n");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rkey);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
        if (local_138.size != 0) {
          pQVar15 = (QTextStream *)QTextStream::operator<<(t,"\t");
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_138);
          Qt::endl(pQVar15);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        pSVar20 = (SubTarget *)(pPVar14->super_QList<ProString>).d.ptr;
      }
      if ((in_ECX & 1) != 0) {
        ProString::ProString(&rkey.super_ProString,"install_subtargets");
        pQVar4 = this->project;
        ProKey::ProKey(&rtkey,"INSTALLDEPS");
        pQVar18 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
                   super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar18,&rkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        ProString::ProString(&rkey.super_ProString,"uninstall_subtargets");
        pQVar4 = this->project;
        ProKey::ProKey(&rtkey,"UNINSTALLDEPS");
        pQVar18 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
                   super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar18,&rkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        writeInstalls(this,t,true);
      }
      QTextStream::operator<<(t,"FORCE:\n\n");
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[7])(this);
      if (this_00 != (default_delete<SequentialInstallData> *)0x0) {
        std::default_delete<SequentialInstallData>::operator()(this_00,(SequentialInstallData *)t);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    rtkey.super_ProString.m_string.d.d = local_a8.ptr[(long)pDVar23].d.d;
    rtkey.super_ProString.m_string.d.ptr = local_a8.ptr[(long)pDVar23].d.ptr;
    rtkey.super_ProString.m_string.d.size = local_a8.ptr[(long)pDVar23].d.size;
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((in_ECX & 1) == 0) {
      QString::QString(&rkey.super_ProString.m_string,"install");
      cVar12 = QString::endsWith((QString *)&rtkey,(CaseSensitivity)&rkey.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
      if (cVar12 == '\0') goto LAB_001559ec;
    }
    else {
LAB_001559ec:
      pQVar15 = (QTextStream *)QTextStream::operator<<(t,(QString *)&rtkey);
      QTextStream::operator<<(pQVar15,":");
      for (uVar27 = 0; uVar27 < (ulong)(this_01->d).size; uVar27 = uVar27 + 1) {
        pSVar20 = (this_01->d).ptr[uVar27];
        pQVar4 = this->project;
        local_2a8.m_string.d.ptr = L".CONFIG";
        local_2a8.m_string.d.d = (Data *)pSVar20;
        ProString::ProString<QString&,char_const(&)[8]>
                  (&rkey.super_ProString,(QStringBuilder<QString_&,_const_char_(&)[8]> *)&local_2a8)
        ;
        pQVar18 = &QMakeEvaluator::valuesRef
                             (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                   super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        bVar28 = comparesEqual((QString *)&rtkey,"make_first");
        if (((!bVar28) ||
            (qVar19 = QtPrivate::indexOf<ProString,char[18]>
                                (pQVar18,(char (*) [18])"no_default_target",0), qVar19 == -1)) &&
           (((bVar28 = comparesEqual((QString *)&rtkey,"install_subtargets"), !bVar28 &&
             (bVar28 = comparesEqual((QString *)&rtkey,"uninstall_subtargets"), !bVar28)) ||
            (qVar19 = QtPrivate::indexOf<ProString,char[19]>
                                (pQVar18,(char (*) [19])"no_default_install",0), qVar19 == -1)))) {
          rkey.super_ProString.m_string.d.size = -0x5555555555555556;
          rkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          rkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_2a8.m_string.d.d = (Data *)&pSVar20->target;
          local_2a8.m_string.d.ptr = L"-";
          local_2a8.m_string.d.size = (qsizetype)&rtkey;
          QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
          convertTo<QString>(&rkey.super_ProString.m_string,
                             (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                              *)&local_2a8);
          if ((in_ECX & 2) != 0) {
            QString::operator+=(&rkey.super_ProString.m_string,"-ordered");
          }
          pQVar15 = (QTextStream *)QTextStream::operator<<(t," ");
          QTextStream::operator<<(pQVar15,(QString *)&rkey.super_ProString);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        }
      }
      bVar28 = comparesEqual((QString *)&rtkey,"all");
      if ((bVar28) || (bVar28 = comparesEqual((QString *)&rtkey,"make_first"), bVar28)) {
        pQVar15 = (QTextStream *)QTextStream::operator<<(t,' ');
        ProKey::ProKey((ProKey *)&rkey.super_ProString,"ALL_DEPS");
        depVar(&local_2a8.m_string,this,(ProKey *)&rkey.super_ProString);
        QTextStream::operator<<(pQVar15,(QString *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
      }
      bVar28 = comparesEqual((QString *)&rtkey,"clean");
      if (bVar28) {
        pQVar15 = (QTextStream *)QTextStream::operator<<(t,' ');
        ProKey::ProKey((ProKey *)&rkey.super_ProString,"CLEAN_DEPS");
        depVar(&local_2a8.m_string,this,(ProKey *)&rkey.super_ProString);
        QTextStream::operator<<(pQVar15,(QString *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
      }
      else {
        bVar28 = comparesEqual((QString *)&rtkey,"distclean");
        if (bVar28) {
          pQVar15 = (QTextStream *)QTextStream::operator<<(t,' ');
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"DISTCLEAN_DEPS");
          depVar(&local_2a8.m_string,this,(ProKey *)&rkey.super_ProString);
          QTextStream::operator<<(pQVar15,(QString *)&local_2a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        }
      }
      QTextStream::operator<<(t," FORCE\n");
      bVar28 = comparesEqual((QString *)&rtkey,"clean");
      if (bVar28) {
        ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_CLEAN");
        QString::QString((QString *)&local_118,"\t-$(DEL_FILE) ");
        QString::QString((QString *)&local_138,"\n\t-$(DEL_FILE) ");
        QString::QString((QString *)&local_158,"\n");
        fixFileVarGlue(&local_2a8.m_string,this,(ProKey *)&rkey.super_ProString,
                       (QString *)&local_118,(QString *)&local_138,(QString *)&local_158);
        QTextStream::operator<<(t,(QString *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        pPVar22 = &rkey.super_ProString;
      }
      else {
        bVar28 = comparesEqual((QString *)&rtkey,"distclean");
        if (!bVar28) goto LAB_00155f29;
        local_2a8.m_string.d.size = -0x5555555555555556;
        local_2a8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_2a8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QFile::fileName();
        fileFixify(&local_2a8.m_string,this,&rkey.super_ProString.m_string,(FileFixifyTypes)0x0,true
                  );
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        if ((SubTarget *)local_2a8.m_string.d.size != (SubTarget *)0x0) {
          pQVar15 = (QTextStream *)QTextStream::operator<<(t,"\t-$(DEL_FILE) ");
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                    (&rkey.super_ProString,this,&local_2a8);
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&rkey.super_ProString)
          ;
          Qt::endl(pQVar15);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        }
        ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_DISTCLEAN");
        QString::QString((QString *)&local_138,"\t-$(DEL_FILE) ");
        QString::QString((QString *)&local_158," ");
        QString::QString((QString *)&local_178,"\n");
        fixFileVarGlue((QString *)&local_118,this,(ProKey *)&rkey.super_ProString,
                       (QString *)&local_138,(QString *)&local_158,(QString *)&local_178);
        QTextStream::operator<<(t,(QString *)&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&rkey.super_ProString);
        pPVar22 = &local_2a8;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar22);
    }
LAB_00155f29:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rtkey);
    pDVar23 = (Data *)((long)&(pDVar23->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                              _M_i + 1);
  } while( true );
}

Assistant:

void
MakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    // blasted includes
    const ProStringList &qeui = project->values("QMAKE_EXTRA_INCLUDES");
    for (ProStringList::ConstIterator qeui_it = qeui.begin(); qeui_it != qeui.end(); ++qeui_it)
        t << "include " << (*qeui_it) << Qt::endl;

    if (!(flags & SubTargetSkipDefaultVariables)) {
        writeDefaultVariables(t);
        t << "SUBTARGETS    = ";     // subtargets are sub-directory
        for(int target = 0; target < targets.size(); ++target)
            t << " \\\n\t\t" << targets.at(target)->target;
        t << Qt::endl << Qt::endl;
    }
    writeExtraVariables(t);

    QStringList targetSuffixes;
    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    if (!(flags & SubTargetSkipDefaultTargets)) {
        targetSuffixes << "make_first" << "all" << "clean" << "distclean"
                       << QString((flags & SubTargetInstalls) ? "install_subtargets" : "install")
                       << QString((flags & SubTargetInstalls) ? "uninstall_subtargets" : "uninstall");
    }

    struct SequentialInstallData
    {
        QString targetPrefix;
        QString commands;
        QTextStream commandsStream;
        SequentialInstallData() : commandsStream(&commands) {}
    };
    std::unique_ptr<SequentialInstallData> sequentialInstallData;
    bool dont_recurse = project->isActiveConfig("dont_recurse");

    // generate target rules
    for(int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

        //qmake it
        QString out;
        QString in;
        if(!subtarget->profile.isEmpty()) {
            out = subtarget->makefile;
            in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
            if(out.startsWith(in_directory))
                out = out.mid(in_directory.size());
            out = escapeFilePath(out);
            t << subtarget->target << "-qmake_all: ";
            if (flags & SubTargetOrdered) {
                if (target)
                    t << targets.at(target - 1)->target << "-qmake_all";
            } else {
                if (!subtarget->depends.isEmpty())
                    t << valGlue(subtarget->depends, QString(), "-qmake_all ", "-qmake_all");
            }
            t << " FORCE\n\t";
            if(!in_directory.isEmpty()) {
                t << mkdir_p_asstring(out_directory)
                  << out_directory_cdin;
            }
            t << "$(QMAKE) -o " << out << ' ' << in << buildArgs(false);
            if (!dont_recurse)
                writeSubMakeCall(t, out_directory_cdin, makefilein + " qmake_all");
            else
                t << Qt::endl;
        }

        { //actually compile
            t << subtarget->target << ":";
            auto extraDeps = extraSubTargetDependencies();
            if (!extraDeps.isEmpty())
                t << " " << valList(extraDeps);
            if(!subtarget->depends.isEmpty())
                t << " " << valList(subtarget->depends);
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein);
        }

        for(int suffix = 0; suffix < targetSuffixes.size(); ++suffix) {
            QString s = targetSuffixes.at(suffix);
            if(s == "install_subtargets")
                s = "install";
            else if(s == "uninstall_subtargets")
                s = "uninstall";
            else if(s == "make_first")
                s = QString();

            if (project->isActiveConfig("build_all") && s == "install") {
                if (!sequentialInstallData)
                    sequentialInstallData.reset(new SequentialInstallData);
                sequentialInstallData->targetPrefix += subtarget->target + '-';
                writeSubTargetCall(sequentialInstallData->commandsStream, in_directory, in,
                                   out_directory, out, out_directory_cdin,
                                   makefilein + " " + s);
                chopEndLines(&sequentialInstallData->commands);
            }

            if(flags & SubTargetOrdered) {
                t << subtarget->target << "-" << targetSuffixes.at(suffix) << "-ordered:";
                if(target)
                    t << " " << targets.at(target-1)->target << "-" << targetSuffixes.at(suffix) << "-ordered ";
                t << " FORCE";
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + s);
            }
            t << subtarget->target << "-" << targetSuffixes.at(suffix) << ":";
            if(!subtarget->depends.isEmpty())
                t << " " << valGlue(subtarget->depends, QString(), "-" + targetSuffixes.at(suffix) + " ",
                                    "-"+targetSuffixes.at(suffix));
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein + " " + s);
        }
    }
    t << Qt::endl;

    if (sequentialInstallData) {
        t << sequentialInstallData->targetPrefix << "install: FORCE"
          << sequentialInstallData->commands << Qt::endl << Qt::endl;
    }

    if (!(flags & SubTargetSkipDefaultTargets)) {
        writeMakeQmake(t, true);

        t << "qmake_all:";
        if(!targets.isEmpty()) {
            for(QList<SubTarget*>::Iterator it = targets.begin(); it != targets.end(); ++it) {
                if(!(*it)->profile.isEmpty())
                    t << " " << (*it)->target << "-qmake_all";
            }
        }
        t << " FORCE\n\n";
    }

    for(int s = 0; s < targetSuffixes.size(); ++s) {
        QString suffix = targetSuffixes.at(s);
        if(!(flags & SubTargetInstalls) && suffix.endsWith("install"))
            continue;

        t << suffix << ":";
        for(int target = 0; target < targets.size(); ++target) {
            SubTarget *subTarget = targets.at(target);
            const ProStringList &config = project->values(ProKey(subTarget->name + ".CONFIG"));
            if (suffix == "make_first"
                && config.indexOf("no_default_target") != -1) {
                continue;
            }
            if((suffix == "install_subtargets" || suffix == "uninstall_subtargets")
                && config.indexOf("no_default_install") != -1) {
                continue;
            }
            QString targetRule = subTarget->target + "-" + suffix;
            if(flags & SubTargetOrdered)
                targetRule += "-ordered";
            t << " " << targetRule;
        }
        if(suffix == "all" || suffix == "make_first")
            t << ' ' << depVar("ALL_DEPS");
        if(suffix == "clean")
            t << ' ' << depVar("CLEAN_DEPS");
        else if (suffix == "distclean")
            t << ' ' << depVar("DISTCLEAN_DEPS");
        t << " FORCE\n";
        if(suffix == "clean") {
            t << fixFileVarGlue("QMAKE_CLEAN", "\t-$(DEL_FILE) ", "\n\t-$(DEL_FILE) ", "\n");
        } else if(suffix == "distclean") {
            QString ofile = fileFixify(Option::output.fileName());
            if(!ofile.isEmpty())
                t << "\t-$(DEL_FILE) " << escapeFilePath(ofile) << Qt::endl;
            t << fixFileVarGlue("QMAKE_DISTCLEAN", "\t-$(DEL_FILE) ", " ", "\n");
        }
    }

    // user defined targets
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator qut_it = qut.begin(); qut_it != qut.end(); ++qut_it) {
        const ProStringList &config = project->values(ProKey(*qut_it + ".CONFIG"));
        QString targ = var(ProKey(*qut_it + ".target")),
                 cmd = var(ProKey(*qut_it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*qut_it).toQString();
        t << Qt::endl;

        const ProStringList &deplist = project->values(ProKey(*qut_it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += ' ' + escapeDependencyPath(Option::fixPathToTargetOS(dep, false));
        }
        if (config.indexOf("recursive") != -1) {
            QSet<QString> recurse;
            const ProKey rkey(*qut_it + ".recurse");
            if (project->isSet(rkey)) {
                const QStringList values = project->values(rkey).toQStringList();
                recurse = QSet<QString>(values.begin(), values.end());
            } else {
                for(int target = 0; target < targets.size(); ++target)
                    recurse.insert(targets.at(target)->name);
            }
            for(int target = 0; target < targets.size(); ++target) {
                SubTarget *subtarget = targets.at(target);
                QString in_directory = subtarget->in_directory;
                if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
                    in_directory += Option::dir_sep;
                QString out_directory = subtarget->out_directory;
                if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
                    out_directory += Option::dir_sep;
                if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
                    out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

                if(!recurse.contains(subtarget->name))
                    continue;

                QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                                     : "\n\tcd " + escapeFilePath(out_directory) + " && ";
                QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

                QString out;
                QString in;
                if (!subtarget->profile.isEmpty()) {
                    out = subtarget->makefile;
                    in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
                    if (out.startsWith(in_directory))
                        out = out.mid(in_directory.size());
                    out = escapeFilePath(out);
                }

                //write the rule/depends
                if(flags & SubTargetOrdered) {
                    const QString dep = subtarget->target + "-" + (*qut_it) + "_ordered";
                    t << dep << ":";
                    if(target)
                        t << " " << targets.at(target-1)->target << "-" << (*qut_it) << "_ordered ";
                    deps += " " + dep;
                } else {
                    const QString dep = subtarget->target + "-" + (*qut_it);
                    t << dep << ":";
                    if(!subtarget->depends.isEmpty())
                        t << " " << valGlue(subtarget->depends, QString(), "-" + (*qut_it) + " ", "-" + (*qut_it));
                    deps += " " + dep;
                }

                QString sub_targ = targ;
                const ProKey rtkey(*qut_it + ".recurse_target");
                if (project->isSet(rtkey))
                    sub_targ = project->first(rtkey).toQString();

                //write the commands
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + sub_targ);
            }
        }
        if (config.indexOf("phony") != -1)
            deps += " FORCE";
        t << escapeDependencyPath(Option::fixPathToTargetOS(targ, false)) << ":" << deps << "\n";
        if(!cmd.isEmpty())
            t << "\t" << cmd << Qt::endl;
    }

    if(flags & SubTargetInstalls) {
        project->values("INSTALLDEPS")   += "install_subtargets";
        project->values("UNINSTALLDEPS") += "uninstall_subtargets";
        writeInstalls(t, true);
    }
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
}